

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

void arangodb::velocypack::Collection::forEach(Slice slice,Predicate *predicate)

{
  bool bVar1;
  unsigned_long in_RSI;
  ValueLength index;
  ArrayIterator it;
  unsigned_long __args_1;
  Slice in_stack_ffffffffffffffb8;
  Slice in_stack_ffffffffffffffc0;
  ArrayIterator *this;
  ArrayIterator local_30;
  unsigned_long local_10;
  
  local_10 = in_RSI;
  ArrayIterator::ArrayIterator
            ((ArrayIterator *)in_stack_ffffffffffffffb8._start,in_stack_ffffffffffffffc0);
  this = (ArrayIterator *)0x0;
  while( true ) {
    bVar1 = ArrayIterator::valid(&local_30);
    if (!bVar1) {
      return;
    }
    __args_1 = local_10;
    in_stack_ffffffffffffffb8 = ArrayIterator::value(in_stack_ffffffffffffffb8._start);
    bVar1 = std::function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)>::operator()
                      ((function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)> *)this,
                       (Slice *)in_stack_ffffffffffffffb8._start,__args_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    ArrayIterator::next(this);
    this = (ArrayIterator *)((long)&(this->_slice)._start + 1);
  }
  return;
}

Assistant:

void Collection::forEach(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    if (!predicate(it.value(), index)) {
      // abort
      return;
    }
    it.next();
    ++index;
  }
}